

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetItemQuery
          (JavascriptProxy *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  Type *this_00;
  ImplicitCallFlags IVar1;
  PropertyId propertyId;
  Type TVar2;
  ScriptContext *scriptContext;
  ThreadContext *this_01;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptFunction *pJVar10;
  Var pvVar11;
  JavascriptMethod p_Var12;
  RecyclableObject *ptr;
  JavascriptFunction *pJVar13;
  undefined4 *puVar14;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_100;
  PropertyRecord *local_d0;
  PropertyRecord *propertyRecord;
  PropertyDescriptor result;
  char local_75;
  char local_74;
  char local_73;
  
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_01 = requestContext->threadContext;
  if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    pvVar8 = CrossSite::MarshalVar(requestContext,(this->handler).ptr,false);
    if (pvVar8 != (Var)0x0) {
      pRVar9 = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this->target).ptr,false);
      pJVar10 = GetMethodHelper(this,0x198,requestContext);
      if ((pJVar10 == (JavascriptFunction *)0x0) ||
         (bVar4 = Memory::Recycler::IsHeapEnumInProgress(requestContext->recycler), bVar4)) {
        result.enumerableSpecified = false;
        BVar6 = JavascriptOperators::GetItem(originalInstance,pRVar9,index,value,requestContext);
        if (BVar6 == 0) goto LAB_00cfa107;
      }
      else {
        PropertyIdFromInt(this,index,&local_d0);
        propertyId = local_d0->pid;
        result.enumerableSpecified = true;
        pvVar11 = GetName(requestContext,propertyId);
        bVar4 = this_01->reentrancySafeOrHandled;
        this_01->reentrancySafeOrHandled = true;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar10);
        bVar5 = ThreadContext::HasNoSideEffect(this_01,(RecyclableObject *)pJVar10,attributes);
        if (bVar5) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
          if (this_01->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
          CheckIsExecutable((RecyclableObject *)pJVar10,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
          ptr = (RecyclableObject *)
                (*p_Var12)((RecyclableObject *)pJVar10,(CallInfo)pJVar10,0x2000004,0,0,0,0,0x2000004
                           ,pvVar8,pRVar9,pvVar11,originalInstance);
          bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00cfa208:
          if (bVar5 != false) {
            this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
            if (this_01->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
            CheckIsExecutable((RecyclableObject *)pJVar10,p_Var12);
            p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
            ptr = (RecyclableObject *)
                  (*p_Var12)((RecyclableObject *)pJVar10,(CallInfo)pJVar10,0x2000004,0,0,0,0,
                             0x2000004,pvVar8,pRVar9,pvVar11,originalInstance);
            bVar5 = ThreadContext::IsOnStack(ptr);
            goto LAB_00cfa208;
          }
          IVar1 = this_01->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
          if (this_01->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
          CheckIsExecutable((RecyclableObject *)pJVar10,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar10);
          ptr = (RecyclableObject *)
                (*p_Var12)((RecyclableObject *)pJVar10,(CallInfo)pJVar10,0x2000004,0,0,0,0,0x2000004
                           ,pvVar8,pRVar9,pvVar11,originalInstance);
          this_01->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((pJVar10->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                undefinedValue.ptr;
        }
        this_01->reentrancySafeOrHandled = bVar4;
        this_00 = &result.Configurable;
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)this_00);
        pJVar10 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
        BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                          (pRVar9,propertyId,requestContext,(PropertyDescriptor *)this_00);
        if (BVar6 != 0) {
          JavascriptOperators::CompletePropertyDescriptor
                    ((PropertyDescriptor *)this_00,(PropertyDescriptor *)0x0,requestContext);
          if (((local_75 != '\x01') ||
              (bVar4 = PropertyDescriptor::IsConfigurable
                                 ((PropertyDescriptor *)&result.Configurable), bVar4)) ||
             (bVar4 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&result.Configurable),
             bVar4)) {
            if (((local_74 != '\0') || (local_73 == '\x01')) &&
               ((bVar4 = PropertyDescriptor::IsConfigurable
                                   ((PropertyDescriptor *)&result.Configurable), !bVar4 &&
                (pJVar13 = (JavascriptFunction *)
                           PropertyDescriptor::GetGetter((PropertyDescriptor *)&result.Configurable)
                , pJVar13 == pJVar10)))) {
              if (ptr == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar14 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00cfa5fd;
                *puVar14 = 0;
              }
              else {
                bVar4 = TaggedInt::Is(ptr);
                if ((bVar4) || ((ulong)ptr >> 0x32 != 0)) goto LAB_00cfa5e9;
              }
              pRVar9 = UnsafeVarTo<Js::RecyclableObject>(ptr);
              if (pRVar9 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar14 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00cfa5fd;
                *puVar14 = 0;
              }
              TVar2 = ((pRVar9->type).ptr)->typeId;
              if (0x57 < (int)TVar2) {
                BVar6 = RecyclableObject::IsExternal(pRVar9);
                if (BVar6 == 0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar14 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                              "GetTypeId aValue has invalid TypeId");
                  if (!bVar4) {
LAB_00cfa5fd:
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  *puVar14 = 0;
                }
LAB_00cfa5e9:
                JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
              }
              if (TVar2 != TypeIds_Undefined) goto LAB_00cfa5e9;
            }
          }
          else {
            bVar4 = JavascriptConversion::SameValueCommon<false>(ptr,(Var)result._40_8_);
            if (!bVar4) goto LAB_00cfa5e9;
          }
        }
        PropertyDescriptor::SetValue((PropertyDescriptor *)&propertyRecord,ptr);
        this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
      }
      if (result.enumerableSpecified != true) {
        return Property_Found;
      }
      this_02 = &local_100;
      PropertyDescriptor::PropertyDescriptor(&local_100,(PropertyDescriptor *)&propertyRecord);
      pRVar9 = (RecyclableObject *)
               GetValueFromDescriptor
                         ((JavascriptProxy *)this_02,originalInstance,&local_100,requestContext);
      PVar7 = Property_Found;
      goto LAB_00cfa114;
    }
    bVar4 = ThreadContext::RecordImplicitException(this_01);
    if (bVar4) {
      JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"get");
    }
  }
  else {
    this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
  }
LAB_00cfa107:
  pRVar9 = ScriptContext::GetMissingItemResult(requestContext);
  PVar7 = Property_NotFound;
LAB_00cfa114:
  *value = pRVar9;
  return PVar7;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetItem(originalInstance, object, index, value, requestContext);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingItemResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }